

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O1

bool __thiscall QWidgetResizeHandler::eventFilter(QWidgetResizeHandler *this,QObject *o,QEvent *ee)

{
  int iVar1;
  QWidget *pQVar2;
  QWidgetData *pQVar3;
  long lVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  char cVar8;
  QWidget *pQVar9;
  QPoint QVar10;
  byte bVar11;
  long in_FS_OFFSET;
  QPoint cursorPoint;
  QPointF local_68;
  QPoint local_58;
  QPoint local_50;
  QPoint local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)this[0x40] & 4) != 0) {
    bVar7 = false;
    if ((0x33 < (ulong)*(ushort *)(ee + 8)) ||
       (bVar7 = false, (0x800000000006cU >> ((ulong)*(ushort *)(ee + 8) & 0x3f) & 1) == 0))
    goto LAB_00475428;
    pQVar2 = *(QWidget **)(this + 0x10);
    pQVar9 = QApplication::activePopupWidget();
    if (pQVar9 == (QWidget *)0x0) {
      switch(*(short *)(ee + 8)) {
      case 2:
        bVar5 = QWidget::isMaximized(pQVar2);
        if (bVar5) {
          bVar5 = false;
        }
        else {
          pQVar2 = *(QWidget **)(this + 0x10);
          pQVar3 = pQVar2->data;
          iVar1 = *(int *)(this + 0x3c);
          local_48.yp.m_i = -iVar1;
          local_48.xp.m_i = -iVar1;
          uStack_40 = CONCAT44(((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + iVar1,
                               ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + iVar1);
          local_50 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
          local_68.xp = (qreal)QEventPoint::globalPosition();
          local_58 = QPointF::toPoint(&local_68);
          local_50 = QWidget::mapFromGlobal(pQVar2,&local_58);
          bVar7 = false;
          cVar8 = QRect::contains(&local_48,SUB81(&local_50,0));
          bVar5 = true;
          if (cVar8 != '\0') {
            bVar7 = false;
            if (*(int *)(ee + 0x40) == 1) {
              this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe);
              QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)0x0);
              mouseMoveEvent(this,(QMouseEvent *)ee);
              this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] | 1);
              pQVar2 = *(QWidget **)(this + 0x10);
              local_68.xp = (qreal)QEventPoint::globalPosition();
              local_58 = QPointF::toPoint(&local_68);
              QVar10 = QWidget::mapFromGlobal(pQVar2,&local_58);
              *(QPoint *)(this + 0x20) = QVar10;
              lVar4 = *(long *)(*(long *)(this + 0x10) + 0x20);
              *(ulong *)(this + 0x28) =
                   CONCAT44(*(int *)(lVar4 + 0x20) -
                            (*(int *)(lVar4 + 0x18) + *(int *)(this + 0x24)),
                            *(int *)(lVar4 + 0x1c) -
                            (*(int *)(lVar4 + 0x14) + *(int *)(this + 0x20)));
              bVar7 = true;
              if (*(int *)(this + 0x30) != 9) goto LAB_00475420;
            }
            bVar5 = false;
          }
        }
LAB_00475420:
        if (bVar5) goto LAB_00475428;
        break;
      case 3:
        bVar7 = QWidget::isMaximized(pQVar2);
        if ((!bVar7) && (*(int *)(ee + 0x40) == 1)) {
          this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfc);
          QWidget::releaseMouse(*(QWidget **)(this + 0x10));
          QWidget::releaseKeyboard(*(QWidget **)(this + 0x10));
LAB_00475466:
          bVar7 = true;
          if (*(int *)(this + 0x30) != 9) goto LAB_00475428;
        }
        break;
      case 4:
        break;
      case 5:
        bVar7 = QWidget::isMaximized(pQVar2);
        if (!bVar7) {
          if (((byte)this[0x40] & 1) == 0) {
            bVar11 = 0;
          }
          else {
            bVar11 = (byte)ee[0x44] & 1;
          }
          this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe | bVar11);
          mouseMoveEvent(this,(QMouseEvent *)ee);
          goto LAB_00475466;
        }
        break;
      case 6:
        keyPressEvent(this,(QKeyEvent *)ee);
        break;
      default:
        if (*(short *)(ee + 8) == 0x33) {
          bVar6 = QGuiApplication::mouseButtons();
          bVar11 = (byte)this[0x40] & 1;
          if ((bVar6 & 1) == 0) {
            bVar11 = 0;
          }
          this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe | bVar11);
          if (bVar11 != 0) {
            ee[0xc] = (QEvent)0x1;
            bVar7 = true;
            goto LAB_00475428;
          }
        }
      }
    }
    else if ((((byte)this[0x40] & 1) != 0) && (*(short *)(ee + 8) == 3)) {
      this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe);
    }
  }
  bVar7 = false;
LAB_00475428:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QWidgetResizeHandler::eventFilter(QObject *o, QEvent *ee)
{
    if (!isEnabled()
        || (ee->type() != QEvent::MouseButtonPress
            && ee->type() != QEvent::MouseButtonRelease
            && ee->type() != QEvent::MouseMove
            && ee->type() != QEvent::KeyPress
            && ee->type() != QEvent::ShortcutOverride)
        )
        return false;

    Q_ASSERT(o == widget);
    QWidget *w = widget;
    if (QApplication::activePopupWidget()) {
        if (buttonDown && ee->type() == QEvent::MouseButtonRelease)
            buttonDown = false;
        return false;
    }

    switch (ee->type()) {
    case QEvent::MouseButtonPress: {
        QMouseEvent *e = static_cast<QMouseEvent *>(ee);
        if (w->isMaximized())
            break;
        const QRect widgetRect = widget->rect().marginsAdded(QMargins(range, range, range, range));
        const QPoint cursorPoint = widget->mapFromGlobal(e->globalPosition().toPoint());
        if (!widgetRect.contains(cursorPoint))
            return false;
        if (e->button() == Qt::LeftButton) {
            buttonDown = false;
            emit activate();
            mouseMoveEvent(e);
            buttonDown = true;
            moveOffset = widget->mapFromGlobal(e->globalPosition().toPoint());
            invertedMoveOffset = widget->rect().bottomRight() - moveOffset;
            if (mode != Center)
                return true;
        }
    } break;
    case QEvent::MouseButtonRelease:
        if (w->isMaximized())
            break;
        if (static_cast<QMouseEvent *>(ee)->button() == Qt::LeftButton) {
            active = false;
            buttonDown = false;
            widget->releaseMouse();
            widget->releaseKeyboard();
            if (mode != Center)
                return true;
        }
        break;
    case QEvent::MouseMove: {
        if (w->isMaximized())
            break;
        QMouseEvent *e = static_cast<QMouseEvent *>(ee);
        buttonDown = buttonDown && (e->buttons() & Qt::LeftButton); // safety, state machine broken!
        mouseMoveEvent(e);
        if (mode != Center)
            return true;
    } break;
    case QEvent::KeyPress:
        keyPressEvent(static_cast<QKeyEvent *>(ee));
        break;
    case QEvent::ShortcutOverride:
        buttonDown &= ((QGuiApplication::mouseButtons() & Qt::LeftButton) != Qt::NoButton);
        if (buttonDown) {
            ee->accept();
            return true;
        }
        break;
    default:
        break;
    }

    return false;
}